

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86.cpp
# Opt level: O1

int __thiscall ncnn::Convolution1D_x86::create_pipeline(Convolution1D_x86 *this,Option *opt)

{
  _func_int *p_Var1;
  _func_int **pp_Var2;
  _func_int **pp_Var3;
  void *pvVar4;
  size_t sVar5;
  size_t sVar6;
  int _h;
  undefined4 *puVar7;
  int i;
  ulong uVar8;
  long lVar9;
  undefined4 *puVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  undefined4 *puVar15;
  undefined4 *puVar16;
  int iVar17;
  ulong uVar18;
  undefined4 *puVar19;
  ulong local_c8;
  Mat local_78;
  
  p_Var1 = this->_vptr_Convolution1D_x86[-3];
  if (*(int *)(&this->field_0x140 + (long)p_Var1) == 0) {
    uVar12 = (long)*(int *)(&this->field_0xf0 + (long)p_Var1) /
             (long)*(int *)(&this->field_0xd4 + (long)p_Var1);
    uVar12 = (long)((ulong)(uint)((int)uVar12 >> 0x1f) << 0x20 | uVar12 & 0xffffffff) /
             (long)(int)*(uint *)(&this->field_0xd0 + (long)p_Var1);
    _h = (int)uVar12;
    uVar14 = 1;
    uVar18 = 1;
    if (opt->use_packing_layout == true) {
      uVar14 = (ulong)((uint)((uVar12 & 3) == 0) * 3 + 1);
      uVar18 = (ulong)((uint)((*(uint *)(&this->field_0xd0 + (long)p_Var1) & 3) == 0) * 3 + 1);
    }
    p_Var1 = this->_vptr_Convolution1D_x86[-3];
    Mat::reshape(&local_78,(Mat *)(&this->field_0x148 + (long)p_Var1),
                 *(int *)(&this->field_0xd4 + (long)p_Var1),_h,
                 *(int *)(&this->field_0xd0 + (long)p_Var1),(Allocator *)0x0);
    iVar13 = (int)uVar14;
    iVar17 = (int)uVar18;
    Mat::create(&this->weight_data_packed,
                *(int *)(&this->field_0xd4 + (long)this->_vptr_Convolution1D_x86[-3]),
                (int)((long)((ulong)(uint)(_h >> 0x1f) << 0x20 | uVar12 & 0xffffffff) / (long)iVar13
                     ),*(int *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86[-3]) /
                       iVar17,(ulong)(uint)(iVar17 * iVar13 * 4),iVar17 * iVar13,(Allocator *)0x0);
    pp_Var2 = this->_vptr_Convolution1D_x86;
    if (iVar17 <= *(int *)(&this->field_0xd0 + (long)pp_Var2[-3])) {
      pp_Var3 = this->_vptr_Convolution1D_x86;
      pvVar4 = (this->weight_data_packed).data;
      sVar5 = (this->weight_data_packed).cstep;
      sVar6 = (this->weight_data_packed).elemsize;
      local_c8 = 0;
      do {
        if (iVar13 <= _h) {
          puVar7 = (undefined4 *)(((local_c8 & 0xffffffff) / uVar18) * sVar5 * sVar6 + (long)pvVar4)
          ;
          puVar19 = (undefined4 *)
                    (local_78.cstep * local_78.elemsize * local_c8 + (long)local_78.data);
          lVar9 = 0;
          do {
            if (0 < *(int *)(&this->field_0xd4 + (long)pp_Var3[-3])) {
              lVar11 = 0;
              puVar10 = puVar19;
              do {
                uVar8 = 0;
                puVar16 = puVar10;
                uVar12 = uVar18;
                puVar15 = puVar10;
                do {
                  do {
                    *puVar7 = *puVar16;
                    puVar7 = puVar7 + 1;
                    uVar12 = uVar12 - 1;
                    puVar16 = (undefined4 *)((long)puVar16 + local_78.cstep * local_78.elemsize);
                  } while (uVar12 != 0);
                  uVar8 = uVar8 + 1;
                  puVar16 = (undefined4 *)((long)puVar15 + (long)local_78.w * local_78.elemsize);
                  uVar12 = uVar18;
                  puVar15 = puVar16;
                } while (uVar8 != uVar14);
                lVar11 = lVar11 + 1;
                puVar10 = puVar10 + 1;
              } while (lVar11 < *(int *)(&this->field_0xd4 + (long)pp_Var3[-3]));
            }
            lVar9 = lVar9 + uVar14;
            puVar19 = (undefined4 *)((long)puVar19 + (long)local_78.w * local_78.elemsize * uVar14);
          } while (lVar9 < (long)((long)_h - (ulong)(iVar13 - 1)));
        }
        local_c8 = local_c8 + uVar18;
      } while ((long)((iVar17 - 1) + local_c8) <
               (long)*(int *)(&this->field_0xd0 + (long)pp_Var2[-3]));
    }
    if (local_78.refcount != (int *)0x0) {
      LOCK();
      *local_78.refcount = *local_78.refcount + -1;
      UNLOCK();
      if (*local_78.refcount == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          if (local_78.data != (void *)0x0) {
            free(local_78.data);
          }
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return 0;
}

Assistant:

int Convolution1D_x86::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    int num_input = weight_data_size / kernel_w / num_output;

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // src = kw-inch-outch
    // dst = pb-pa-kw-inch/pa-outch/pb
    {
        Mat weight_data_r2 = weight_data.reshape(kernel_w, num_input, num_output);

        weight_data_packed.create(kernel_w, num_input / elempack, num_output / out_elempack, (size_t)4u * elempack * out_elempack, elempack * out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            float* g00 = weight_data_packed.channel(q / out_elempack);

            for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
            {
                for (int k = 0; k < kernel_w; k++)
                {
                    for (int i = 0; i < elempack; i++)
                    {
                        for (int j = 0; j < out_elempack; j++)
                        {
                            const float* k00 = weight_data_r2.channel(q + j).row(p + i);

                            g00[0] = k00[k];

                            g00++;
                        }
                    }
                }
            }
        }
    }

    return 0;
}